

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_zip.c
# Opt level: O0

exr_result_t
undo_zip_impl(exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
             void *uncompressed_data,uint64_t uncompressed_size,void *scratch_data,
             uint64_t scratch_size)

{
  uint8_t *in_RDX;
  size_t *in_RDI;
  ulong in_R8;
  exr_result_t res;
  void *unaff_retaddr;
  size_t actual_out_bytes;
  uint in_stack_ffffffffffffffb8;
  uint8_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar1;
  
  if (actual_out_bytes < in_R8) {
    eVar1 = 3;
  }
  else {
    eVar1 = exr_uncompress_buffer
                      ((exr_const_context_t)uncompressed_size,scratch_data,actual_out_bytes,
                       unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI);
    if (eVar1 == 0) {
      in_RDI[0xd] = (size_t)in_stack_ffffffffffffffc0;
      if (in_stack_ffffffffffffffc0 < in_RDX) {
        eVar1 = 0x17;
      }
      else {
        internal_zip_reconstruct_bytes
                  (in_stack_ffffffffffffffc0,(uint8_t *)(ulong)in_stack_ffffffffffffffb8,0x230667);
      }
    }
  }
  return eVar1;
}

Assistant:

static exr_result_t
undo_zip_impl (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size,
    void*                  scratch_data,
    uint64_t               scratch_size)
{
    size_t       actual_out_bytes;
    exr_result_t res;

    if (scratch_size < uncompressed_size) return EXR_ERR_INVALID_ARGUMENT;

    res = exr_uncompress_buffer (
        decode->context,
        compressed_data,
        comp_buf_size,
        scratch_data,
        scratch_size,
        &actual_out_bytes);

    if (res == EXR_ERR_SUCCESS)
    {
        decode->bytes_decompressed = actual_out_bytes;
        if (comp_buf_size > actual_out_bytes)
            res = EXR_ERR_CORRUPT_CHUNK;
        else
            internal_zip_reconstruct_bytes (
                uncompressed_data, scratch_data, actual_out_bytes);
    }

    return res;
}